

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::torrent::tracker_request_error
          (torrent *this,tracker_request *r,error_code *ec,operation_t op,string *msg,
          seconds32 retry_interval)

{
  int *piVar1;
  announce_infohash *this_00;
  error_code *peVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  pointer pcVar7;
  pointer paVar8;
  ulong uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined3 uVar12;
  bool bVar13;
  bool bVar14;
  char cVar15;
  int iVar16;
  time_point32 now;
  char *pcVar17;
  announce_entry *ae;
  announce_endpoint *paVar18;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  error_category *peVar19;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  pointer paVar20;
  pointer paVar21;
  endpoint *ep;
  endpoint *extraout_RDX;
  endpoint *ep_00;
  endpoint *extraout_RDX_00;
  endpoint *ep_01;
  long lVar22;
  long *plVar23;
  long lVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  array<const_bool,_num_protocols,_protocol_version> supports_protocol;
  protocol_version hash_version;
  operation_t op_local;
  announce_entry *local_d0;
  endpoint local_endpoint_1;
  int fails;
  tracker_list *local_98;
  seconds32 local_8c;
  endpoint local_endpoint;
  protocol_version hash_version_1;
  
  op_local = op;
  local_8c.__r = retry_interval.__r;
  bVar13 = digest32<160L>::is_all_zeros(&(this->m_info_hash).v1);
  bVar14 = digest32<256L>::is_all_zeros(&(this->m_info_hash).v2);
  supports_protocol.super_array<const_bool,_2UL>._M_elems[1] = !bVar14;
  supports_protocol.super_array<const_bool,_2UL>._M_elems[0] = !bVar13;
  iVar16 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
  if ((char)iVar16 != '\0') {
    uVar4 = ec->val_;
    (*ec->cat_->_vptr_error_category[4])(&local_endpoint_1,ec->cat_,(ulong)uVar4);
    uVar10 = local_endpoint_1.impl_.data_._0_8_;
    pcVar17 = operation_name(op_local);
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,"*** tracker error: (%d) %s [%s] %s",(ulong)uVar4,uVar10,pcVar17,
               (msg->_M_dataplus)._M_p);
    if ((undefined1 *)local_endpoint_1.impl_.data_._0_8_ !=
        (undefined1 *)((long)&local_endpoint_1.impl_.data_ + 0x10)) {
      operator_delete((void *)local_endpoint_1.impl_.data_._0_8_,
                      CONCAT44(local_endpoint_1.impl_.data_._20_4_,
                               local_endpoint_1.impl_.data_._16_4_) + 1);
    }
  }
  local_98 = &this->m_trackers;
  bVar3 = (r->kind).m_val;
  ae = tracker_list::find_tracker(local_98,&r->url);
  if ((bVar3 & 1) == 0) {
    fails = 0;
    local_endpoint.impl_.data_._8_4_ = 0;
    local_endpoint.impl_.data_._12_4_ = 0;
    local_endpoint.impl_.data_._16_4_ = 0;
    local_endpoint.impl_.data_._20_8_ = 0;
    local_endpoint.impl_.data_._0_8_ = 2;
    hash_version = V1;
    if (ae != (announce_entry *)0x0) {
      local_d0 = ae;
      paVar18 = announce_entry::find_endpoint(ae,&r->outgoing_socket);
      if (paVar18 == (announce_endpoint *)0x0) {
        p_Var6 = (r->outgoing_socket).m_sock.
                 super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        if ((p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (p_Var6->_M_use_count != 0)) {
          pcVar7 = (r->url)._M_dataplus._M_p;
          listen_socket_handle::get_local_endpoint((endpoint *)&hash_version_1,&r->outgoing_socket);
          print_endpoint_abi_cxx11_((string *)&local_endpoint_1,(aux *)&hash_version_1,ep_00);
          (*(this->super_request_callback)._vptr_request_callback[7])
                    (this,"*** no matching endpoint for request [%s, %s]",pcVar7,
                     local_endpoint_1.impl_.data_._0_8_);
          if ((undefined1 *)local_endpoint_1.impl_.data_._0_8_ !=
              (undefined1 *)((long)&local_endpoint_1.impl_.data_ + 0x10)) {
            operator_delete((void *)local_endpoint_1.impl_.data_._0_8_,
                            CONCAT44(local_endpoint_1.impl_.data_._20_4_,
                                     local_endpoint_1.impl_.data_._16_4_) + 1);
          }
        }
      }
      else {
        auVar25[0] = -((char)(r->info_hash).m_number._M_elems[0] ==
                      (char)(this->m_info_hash).v1.m_number._M_elems[0]);
        auVar25[1] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 1) ==
                      *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 1));
        auVar25[2] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 2) ==
                      *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 2));
        auVar25[3] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 3) ==
                      *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 3));
        auVar25[4] = -((char)(r->info_hash).m_number._M_elems[1] ==
                      (char)(this->m_info_hash).v1.m_number._M_elems[1]);
        auVar25[5] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 5) ==
                      *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 5));
        auVar25[6] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 6) ==
                      *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 6));
        auVar25[7] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 7) ==
                      *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 7));
        auVar25[8] = -((char)(r->info_hash).m_number._M_elems[2] ==
                      (char)(this->m_info_hash).v1.m_number._M_elems[2]);
        auVar25[9] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 9) ==
                      *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 9));
        auVar25[10] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 10) ==
                       *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 10));
        auVar25[0xb] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 0xb) ==
                        *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 0xb));
        auVar25[0xc] = -((char)(r->info_hash).m_number._M_elems[3] ==
                        (char)(this->m_info_hash).v1.m_number._M_elems[3]);
        auVar25[0xd] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 0xd) ==
                        *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 0xd));
        auVar25[0xe] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 0xe) ==
                        *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 0xe));
        auVar25[0xf] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 0xf) ==
                        *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 0xf));
        uVar4 = (this->m_info_hash).v1.m_number._M_elems[4];
        uVar5 = (r->info_hash).m_number._M_elems[4];
        auVar27[0] = -((char)uVar5 == (char)uVar4);
        auVar27[1] = -((char)(uVar5 >> 8) == (char)(uVar4 >> 8));
        auVar27[2] = -((char)(uVar5 >> 0x10) == (char)(uVar4 >> 0x10));
        auVar27[3] = -((char)(uVar5 >> 0x18) == (char)(uVar4 >> 0x18));
        auVar27[4] = 0xff;
        auVar27[5] = 0xff;
        auVar27[6] = 0xff;
        auVar27[7] = 0xff;
        auVar27[8] = 0xff;
        auVar27[9] = 0xff;
        auVar27[10] = 0xff;
        auVar27[0xb] = 0xff;
        auVar27[0xc] = 0xff;
        auVar27[0xd] = 0xff;
        auVar27[0xe] = 0xff;
        auVar27[0xf] = 0xff;
        auVar27 = auVar27 & auVar25;
        bVar14 = (ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar27[0xf] >> 7) << 0xf) != 0xffff;
        this_00 = (paVar18->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>.
                  _M_elems + bVar14;
        local_endpoint.impl_.data_._0_8_ = *(undefined8 *)&(paVar18->local_endpoint).impl_.data_;
        uVar10 = *(undefined8 *)((long)&(paVar18->local_endpoint).impl_.data_ + 0xc);
        local_endpoint.impl_.data_._20_8_ =
             *(undefined8 *)((long)&(paVar18->local_endpoint).impl_.data_ + 0x14);
        local_endpoint.impl_.data_._8_4_ =
             (undefined4)*(undefined8 *)((long)&(paVar18->local_endpoint).impl_.data_ + 8);
        local_endpoint.impl_.data_._12_4_ = (undefined4)uVar10;
        local_endpoint.impl_.data_._16_4_ = (undefined4)((ulong)uVar10 >> 0x20);
        hash_version = bVar14;
        iVar16 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                   _vptr_session_logger[0x2e])();
        local_endpoint_1.impl_.data_._0_8_ = CONCAT44(extraout_var,iVar16) + 0x438;
        local_endpoint_1.impl_.data_._8_4_ = local_endpoint_1.impl_.data_._8_4_ & 0xffffff00;
        ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_endpoint_1);
        local_endpoint_1.impl_.data_.base.sa_data[6] = 1;
        iVar16 = *(int *)(CONCAT44(extraout_var,iVar16) + 0x358);
        ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_endpoint_1);
        announce_infohash::failed(this_00,iVar16,local_8c);
        bVar13 = ec->failed_;
        uVar12 = *(undefined3 *)&ec->field_0x5;
        peVar19 = ec->cat_;
        peVar2 = &(paVar18->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>.
                  _M_elems[bVar14].last_error;
        peVar2->val_ = ec->val_;
        peVar2->failed_ = bVar13;
        *(undefined3 *)&peVar2->field_0x5 = uVar12;
        peVar2->cat_ = peVar19;
        ::std::__cxx11::string::_M_assign((string *)this_00);
        fails = *(ushort *)
                 &(paVar18->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>.
                  _M_elems[bVar14].field_0x44 & 0x7f;
        print_endpoint_abi_cxx11_((string *)&local_endpoint_1,(aux *)paVar18,ep);
        (*(this->super_request_callback)._vptr_request_callback[7])
                  (this,"*** increment tracker fail count [ep: %s url: %s %d]",
                   local_endpoint_1.impl_.data_._0_8_,(r->url)._M_dataplus._M_p);
        if ((undefined1 *)local_endpoint_1.impl_.data_._0_8_ !=
            (undefined1 *)((long)&local_endpoint_1.impl_.data_ + 0x10)) {
          operator_delete((void *)local_endpoint_1.impl_.data_._0_8_,
                          CONCAT44(local_endpoint_1.impl_.data_._20_4_,
                                   local_endpoint_1.impl_.data_._16_4_) + 1);
        }
        local_endpoint_1.impl_.data_._0_8_ = 0x100000061;
        local_endpoint_1.impl_.data_._8_4_ = 0x4ee510;
        local_endpoint_1.impl_.data_._12_4_ = 0;
        iVar16 = (*ec->cat_->_vptr_error_category[2])(ec->cat_,(ulong)(uint)ec->val_);
        ep_01 = extraout_RDX;
        if (((char)iVar16 != '\0') ||
           (cVar15 = (**(code **)(*(long *)CONCAT44(local_endpoint_1.impl_.data_._12_4_,
                                                    local_endpoint_1.impl_.data_._8_4_) + 0x18))
                               ((long *)CONCAT44(local_endpoint_1.impl_.data_._12_4_,
                                                 local_endpoint_1.impl_.data_._8_4_),ec,
                                local_endpoint_1.impl_.data_._0_8_ & 0xffffffff),
           ep_01 = extraout_RDX_00, cVar15 != '\0')) {
          paVar18->field_0xb0 = paVar18->field_0xb0 & 0xfe;
          print_endpoint_abi_cxx11_((string *)&local_endpoint_1,(aux *)paVar18,ep_01);
          (*(this->super_request_callback)._vptr_request_callback[7])
                    (this,"*** disabling endpoint [ep: %s url: %s ]",
                     local_endpoint_1.impl_.data_._0_8_,(r->url)._M_dataplus._M_p);
          if ((undefined1 *)local_endpoint_1.impl_.data_._0_8_ !=
              (undefined1 *)((long)&local_endpoint_1.impl_.data_ + 0x10)) {
            operator_delete((void *)local_endpoint_1.impl_.data_._0_8_,
                            CONCAT44(local_endpoint_1.impl_.data_._20_4_,
                                     local_endpoint_1.impl_.data_._16_4_) + 1);
          }
        }
      }
      peVar19 = http_category();
      if ((peVar19->id_ != 0x8fafd21e25c5e09b) && (peVar19->id_ != 0xb2ab117a257edf0d)) {
        (*peVar19->_vptr_error_category[6])(peVar19,0x19a);
      }
      if (ec->val_ == 0x19a) {
        bVar13 = ec->cat_->id_ == peVar19->id_;
        if (peVar19->id_ == 0) {
          bVar13 = ec->cat_ == peVar19;
        }
        if (bVar13) {
          tracker_list::dont_try_again(local_98,local_d0);
        }
      }
      paVar20 = (local_d0->endpoints).
                super__Vector_base<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
                ._M_impl.super__Vector_impl_data._M_start;
      paVar8 = (local_d0->endpoints).
               super__Vector_base<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar22 = ((long)paVar8 - (long)paVar20 >> 3) * -0x70a3d70a3d70a3d7 >> 2;
      paVar21 = paVar20;
      if (0 < lVar22) {
        paVar21 = paVar20 + lVar22 * 4;
        do {
          bVar13 = false;
          lVar24 = 0;
          do {
            if ((supports_protocol.super_array<const_bool,_2UL>._M_elems
                 [(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar24]] == true) &&
               (((paVar20->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>.
                 _M_elems[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar24]].
                 field_0x44 & 0x7f) == 0)) break;
            lVar24 = lVar24 + 1;
            bVar13 = lVar24 == 2;
          } while (!bVar13);
          if (!bVar13) goto LAB_0033732a;
          bVar13 = false;
          lVar24 = 0;
          do {
            if ((supports_protocol.super_array<const_bool,_2UL>._M_elems
                 [(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar24]] == true) &&
               ((paVar20[1].info_hashes.super_array<libtorrent::aux::announce_infohash,_2UL>.
                 _M_elems[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar24]].
                 field_0x44 & 0x7f) == 0)) break;
            lVar24 = lVar24 + 1;
            bVar13 = lVar24 == 2;
          } while (!bVar13);
          if (!bVar13) {
            paVar20 = paVar20 + 1;
            goto LAB_0033732a;
          }
          bVar13 = false;
          lVar24 = 0;
          do {
            if ((supports_protocol.super_array<const_bool,_2UL>._M_elems
                 [(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar24]] == true) &&
               ((paVar20[2].info_hashes.super_array<libtorrent::aux::announce_infohash,_2UL>.
                 _M_elems[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar24]].
                 field_0x44 & 0x7f) == 0)) break;
            lVar24 = lVar24 + 1;
            bVar13 = lVar24 == 2;
          } while (!bVar13);
          if (!bVar13) {
            paVar20 = paVar20 + 2;
            goto LAB_0033732a;
          }
          bVar13 = false;
          lVar24 = 0;
          do {
            if ((supports_protocol.super_array<const_bool,_2UL>._M_elems
                 [(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar24]] == true) &&
               ((paVar20[3].info_hashes.super_array<libtorrent::aux::announce_infohash,_2UL>.
                 _M_elems[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar24]].
                 field_0x44 & 0x7f) == 0)) break;
            lVar24 = lVar24 + 1;
            bVar13 = lVar24 == 2;
          } while (!bVar13);
          if (!bVar13) {
            paVar20 = paVar20 + 3;
            goto LAB_0033732a;
          }
          paVar20 = paVar20 + 4;
          bVar13 = 1 < lVar22;
          lVar22 = lVar22 + -1;
        } while (bVar13);
      }
      lVar22 = ((long)paVar8 - (long)paVar21 >> 3) * -0x70a3d70a3d70a3d7;
      if (lVar22 == 1) {
LAB_003372c2:
        bVar13 = false;
        lVar22 = 0;
        do {
          if ((supports_protocol.super_array<const_bool,_2UL>._M_elems
               [(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar22]] == true) &&
             (((paVar21->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>._M_elems
               [(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar22]].field_0x44 & 0x7f)
              == 0)) break;
          lVar22 = lVar22 + 1;
          bVar13 = lVar22 == 2;
        } while (!bVar13);
        paVar20 = paVar21;
        if (bVar13) {
          paVar20 = paVar8;
        }
      }
      else if (lVar22 == 2) {
LAB_0033727e:
        bVar13 = false;
        lVar22 = 0;
        do {
          if ((supports_protocol.super_array<const_bool,_2UL>._M_elems
               [(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar22]] == true) &&
             (((paVar21->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>._M_elems
               [(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar22]].field_0x44 & 0x7f)
              == 0)) break;
          lVar22 = lVar22 + 1;
          bVar13 = lVar22 == 2;
        } while (!bVar13);
        paVar20 = paVar21;
        if (bVar13) {
          paVar21 = paVar21 + 1;
          goto LAB_003372c2;
        }
      }
      else {
        paVar20 = paVar8;
        if (lVar22 == 3) {
          bVar13 = false;
          lVar22 = 0;
          do {
            if ((supports_protocol.super_array<const_bool,_2UL>._M_elems
                 [(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar22]] == true) &&
               (((paVar21->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>.
                 _M_elems[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar22]].
                 field_0x44 & 0x7f) == 0)) break;
            lVar22 = lVar22 + 1;
            bVar13 = lVar22 == 2;
          } while (!bVar13);
          paVar20 = paVar21;
          if (bVar13) {
            paVar21 = paVar21 + 1;
            goto LAB_0033727e;
          }
        }
      }
LAB_0033732a:
      if (paVar20 == paVar8) {
        tracker_list::deprioritize_tracker(local_98,local_d0);
      }
    }
    iVar16 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
               _vptr_session_logger[5])();
    if (((*(uint *)(CONCAT44(extraout_var_02,iVar16) + 0x68) & 0x11) == 0) &&
       (r->triggered_manually != true)) goto LAB_003373dc;
    iVar16 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
               _vptr_session_logger[5])();
    get_handle((torrent *)&local_endpoint_1);
    alert_manager::
    emplace_alert<libtorrent::tracker_error_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,int&,libtorrent::protocol_version&,std::__cxx11::string_const&,libtorrent::operation_t_const&,boost::system::error_code_const&,std::__cxx11::string_const&>
              ((alert_manager *)CONCAT44(extraout_var_03,iVar16),(torrent_handle *)&local_endpoint_1
               ,&local_endpoint,&fails,&hash_version,&r->url,&op_local,ec,msg);
    plVar23 = (long *)CONCAT44(local_endpoint_1.impl_.data_._12_4_,
                               local_endpoint_1.impl_.data_._8_4_);
  }
  else {
    peVar19 = http_category();
    if ((peVar19->id_ != 0x8fafd21e25c5e09b) && (peVar19->id_ != 0xb2ab117a257edf0d)) {
      (*peVar19->_vptr_error_category[6])(peVar19,0x19a);
    }
    if (ec->val_ == 0x19a) {
      bVar13 = ec->cat_->id_ == peVar19->id_;
      if (peVar19->id_ == 0) {
        bVar13 = ec->cat_ == peVar19;
      }
    }
    else {
      bVar13 = false;
    }
    if ((ae != (announce_entry *)0x0) && (bVar13)) {
      tracker_list::dont_try_again(local_98,ae);
    }
    iVar16 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
               _vptr_session_logger[5])();
    if (((*(uint *)(CONCAT44(extraout_var_00,iVar16) + 0x68) & 0x11) == 0) &&
       (r->triggered_manually != true)) goto LAB_003373dc;
    local_endpoint_1.impl_.data_._8_4_ = 0;
    local_endpoint_1.impl_.data_._12_4_ = 0;
    local_endpoint_1.impl_.data_._16_4_ = 0;
    local_endpoint_1.impl_.data_._20_4_ = 0;
    local_endpoint_1.impl_.data_.v6.sin6_scope_id = 0;
    local_endpoint_1.impl_.data_._0_8_ = 2;
    if ((ae != (announce_entry *)0x0) &&
       (paVar18 = announce_entry::find_endpoint(ae,&r->outgoing_socket),
       paVar18 != (announce_endpoint *)0x0)) {
      local_endpoint_1.impl_.data_._0_8_ = *(undefined8 *)&(paVar18->local_endpoint).impl_.data_;
      uVar10 = *(undefined8 *)((long)&(paVar18->local_endpoint).impl_.data_ + 8);
      uVar11 = *(undefined8 *)((long)&(paVar18->local_endpoint).impl_.data_ + 0x14);
      local_endpoint_1.impl_.data_._16_4_ =
           (undefined4)
           ((ulong)*(undefined8 *)((long)&(paVar18->local_endpoint).impl_.data_ + 0xc) >> 0x20);
      local_endpoint_1.impl_.data_._20_4_ = (undefined4)uVar11;
      local_endpoint_1.impl_.data_.v6.sin6_scope_id = (uint32_t)((ulong)uVar11 >> 0x20);
      local_endpoint_1.impl_.data_._8_4_ = (undefined4)uVar10;
      local_endpoint_1.impl_.data_._12_4_ = (undefined4)((ulong)uVar10 >> 0x20);
    }
    auVar26[0] = -((char)(r->info_hash).m_number._M_elems[0] ==
                  (char)(this->m_info_hash).v1.m_number._M_elems[0]);
    auVar26[1] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 1) ==
                  *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 1));
    auVar26[2] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 2) ==
                  *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 2));
    auVar26[3] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 3) ==
                  *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 3));
    auVar26[4] = -((char)(r->info_hash).m_number._M_elems[1] ==
                  (char)(this->m_info_hash).v1.m_number._M_elems[1]);
    auVar26[5] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 5) ==
                  *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 5));
    auVar26[6] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 6) ==
                  *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 6));
    auVar26[7] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 7) ==
                  *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 7));
    auVar26[8] = -((char)(r->info_hash).m_number._M_elems[2] ==
                  (char)(this->m_info_hash).v1.m_number._M_elems[2]);
    auVar26[9] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 9) ==
                  *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 9));
    auVar26[10] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 10) ==
                   *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 10));
    auVar26[0xb] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 0xb) ==
                    *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 0xb));
    auVar26[0xc] = -((char)(r->info_hash).m_number._M_elems[3] ==
                    (char)(this->m_info_hash).v1.m_number._M_elems[3]);
    auVar26[0xd] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 0xd) ==
                    *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 0xd));
    auVar26[0xe] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 0xe) ==
                    *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 0xe));
    auVar26[0xf] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 0xf) ==
                    *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 0xf));
    uVar4 = (this->m_info_hash).v1.m_number._M_elems[4];
    uVar5 = (r->info_hash).m_number._M_elems[4];
    auVar28[0] = -((char)uVar5 == (char)uVar4);
    auVar28[1] = -((char)(uVar5 >> 8) == (char)(uVar4 >> 8));
    auVar28[2] = -((char)(uVar5 >> 0x10) == (char)(uVar4 >> 0x10));
    auVar28[3] = -((char)(uVar5 >> 0x18) == (char)(uVar4 >> 0x18));
    auVar28[4] = 0xff;
    auVar28[5] = 0xff;
    auVar28[6] = 0xff;
    auVar28[7] = 0xff;
    auVar28[8] = 0xff;
    auVar28[9] = 0xff;
    auVar28[10] = 0xff;
    auVar28[0xb] = 0xff;
    auVar28[0xc] = 0xff;
    auVar28[0xd] = 0xff;
    auVar28[0xe] = 0xff;
    auVar28[0xf] = 0xff;
    auVar28 = auVar28 & auVar26;
    hash_version_1 =
         (ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) | (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe |
                 (ushort)(byte)(auVar28[0xf] >> 7) << 0xf) != 0xffff;
    iVar16 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
               _vptr_session_logger[5])();
    get_handle((torrent *)&local_endpoint);
    alert_manager::
    emplace_alert<libtorrent::scrape_failed_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::protocol_version&,std::__cxx11::string_const&,boost::system::error_code_const&>
              ((alert_manager *)CONCAT44(extraout_var_01,iVar16),(torrent_handle *)&local_endpoint,
               &local_endpoint_1,&hash_version_1,&r->url,ec);
    plVar23 = (long *)CONCAT44(local_endpoint.impl_.data_._12_4_,local_endpoint.impl_.data_._8_4_);
  }
  if (plVar23 != (long *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      piVar1 = (int *)((long)plVar23 + 0xc);
      iVar16 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
    }
    else {
      iVar16 = *(int *)((long)plVar23 + 0xc);
      *(int *)((long)plVar23 + 0xc) = iVar16 + -1;
    }
    if (iVar16 == 1) {
      (**(code **)(*plVar23 + 0x18))();
    }
  }
LAB_003373dc:
  uVar9 = *(ulong *)&(this->super_torrent_hot_members).field_0x48;
  if ((((uVar9 & 0x1c000000) == 0) && ((uVar9 & 0xe00000000000000) != 0x200000000000000)) ||
     (r->event == stopped)) {
    announce_with_tracker(this,r->event);
  }
  now = time_now32();
  update_tracker_timer(this,now);
  return;
}

Assistant:

void torrent::tracker_request_error(tracker_request const& r
		, error_code const& ec, operation_t const op, std::string const& msg
		, seconds32 const retry_interval)
	{
		TORRENT_ASSERT(is_single_thread());

		INVARIANT_CHECK;

// some older versions of clang had a bug where it would fire this warning here
#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wmissing-braces"
#endif
		aux::array<bool const, num_protocols, protocol_version> const supports_protocol
		{ {
			m_info_hash.has_v1(),
			m_info_hash.has_v2()
		} };
#ifdef __clang__
#pragma clang diagnostic pop
#endif

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			debug_log("*** tracker error: (%d) %s [%s] %s", ec.value()
				, ec.message().c_str(), operation_name(op), msg.c_str());
		}
#endif
		if (!(r.kind & tracker_request::scrape_request))
		{
			// announce request
			aux::announce_entry* ae = m_trackers.find_tracker(r.url);
			int fails = 0;
			tcp::endpoint local_endpoint;
			protocol_version hash_version = protocol_version::V1;
			if (ae)
			{
				auto* aep = ae->find_endpoint(r.outgoing_socket);
				if (aep)
				{
					hash_version = r.info_hash == m_info_hash.v1
						? protocol_version::V1 : protocol_version::V2;
					auto& a = aep->info_hashes[hash_version];
					local_endpoint = aep->local_endpoint;
					a.failed(settings().get_int(settings_pack::tracker_backoff)
						, retry_interval);
					a.last_error = ec;
					a.message = msg;
					fails = a.fails;

#ifndef TORRENT_DISABLE_LOGGING
					debug_log("*** increment tracker fail count [ep: %s url: %s %d]"
						, print_endpoint(aep->local_endpoint).c_str(), r.url.c_str(), a.fails);
#endif
					if (ec == boost::system::errc::address_family_not_supported)
					{
						// don't try to announce from this endpoint again
						aep->enabled = false;
#ifndef TORRENT_DISABLE_LOGGING
						debug_log("*** disabling endpoint [ep: %s url: %s ]"
							, print_endpoint(aep->local_endpoint).c_str(), r.url.c_str());
#endif
					}
				}
				else if (r.outgoing_socket)
				{
#ifndef TORRENT_DISABLE_LOGGING
					debug_log("*** no matching endpoint for request [%s, %s]"
						, r.url.c_str(), print_endpoint(r.outgoing_socket.get_local_endpoint()).c_str());
#endif
				}

				// never talk to this tracker again
				if (ec == error_code(410, http_category())) m_trackers.dont_try_again(ae);

				// if all endpoints fail, then we de-prioritize the tracker and try
				// the next one in the tier
				if (std::all_of(ae->endpoints.begin(), ae->endpoints.end()
					, [&](aux::announce_endpoint const& ep)
					{
						for (protocol_version const ih : all_versions)
							if (supports_protocol[ih] && ep.info_hashes[ih].is_working())
								return false;
						return true;
					}))
				{
					m_trackers.deprioritize_tracker(ae);
				}
			}
			if (m_ses.alerts().should_post<tracker_error_alert>()
				|| r.triggered_manually)
			{
				m_ses.alerts().emplace_alert<tracker_error_alert>(get_handle()
					, local_endpoint, fails, hash_version, r.url, op, ec, msg);
			}
		}
		else
		{
			aux::announce_entry* ae = m_trackers.find_tracker(r.url);

			// scrape request
			if (ec == error_code(410, http_category()) && ae)
				m_trackers.dont_try_again(ae);

			// if this was triggered manually we need to post this unconditionally,
			// since the client expects a response from its action, regardless of
			// whether all tracker events have been enabled by the alert mask
			if (m_ses.alerts().should_post<scrape_failed_alert>()
				|| r.triggered_manually)
			{
				tcp::endpoint local_endpoint;
				if (ae)
				{
					auto const* aep = ae->find_endpoint(r.outgoing_socket);
					if (aep != nullptr) local_endpoint = aep->local_endpoint;
				}

				protocol_version hash_version = r.info_hash == m_info_hash.v1
					? protocol_version::V1 : protocol_version::V2;

				m_ses.alerts().emplace_alert<scrape_failed_alert>(get_handle()
					, local_endpoint, hash_version, r.url, ec);
			}
		}
		// announce to the next working tracker
		// We may have changed state into checking by now, in which case we
		// shouldn't keep trying to announce
		if ((!m_abort && !is_paused() && state() != torrent_status::checking_files)
			|| r.event == event_t::stopped)
		{
			announce_with_tracker(r.event);
		}
		update_tracker_timer(aux::time_now32());
	}